

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLoad
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint bytes,bool signed_,
          Address offset,uint align,Type type,Name mem)

{
  __index_type *this_00;
  Load *expr;
  bool bVar1;
  Ok local_109;
  size_t local_108;
  char *local_100;
  uintptr_t local_f8;
  address64_t local_f0;
  uint local_e4;
  Err local_e0;
  Err *local_b0;
  Err *err;
  Result<wasm::Ok> _val;
  Load curr;
  uint align_local;
  bool signed__local;
  uint bytes_local;
  IRBuilder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = &_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index;
  curr.memory.super_IString.str._M_str._4_4_ = align;
  Load::Load((Load *)this_00);
  wasm::Name::operator=((Name *)&curr.ptr,&mem);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitLoad
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (Load *)this_00);
  local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_b0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e0,local_b0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  local_e4 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_e4 == 0) {
    local_f8 = type.id;
    local_108 = mem.super_IString.str._M_len;
    local_100 = mem.super_IString.str._M_str;
    local_f0 = offset.addr;
    expr = Builder::makeLoad(&this->builder,bytes,signed_,offset,
                             curr.memory.super_IString.str._M_str._4_4_,(Expression *)curr._40_8_,
                             type,mem);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLoad(unsigned bytes,
                             bool signed_,
                             Address offset,
                             unsigned align,
                             Type type,
                             Name mem) {
  Load curr;
  curr.memory = mem;
  CHECK_ERR(visitLoad(&curr));
  push(builder.makeLoad(bytes, signed_, offset, align, curr.ptr, type, mem));
  return Ok{};
}